

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_calculation.cc
# Opt level: O0

bool __thiscall
sptk::HistogramCalculation::Run
          (HistogramCalculation *this,vector<double,_std::allocator<double>_> *data,
          vector<double,_std::allocator<double>_> *histogram)

{
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __last;
  bool bVar1;
  int iVar2;
  size_type sVar3;
  const_reference pvVar4;
  reference pvVar5;
  vector<double,_std::allocator<double>_> *in_RDX;
  vector<double,_std::allocator<double>_> *in_RSI;
  double *in_RDI;
  double dVar6;
  int bin_index;
  int i;
  double *output;
  double *input;
  int length;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  int iVar7;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffffb0;
  size_type in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  bool local_1;
  
  if (((((ulong)in_RDI[5] & 1) == 0) ||
      (bVar1 = std::vector<double,_std::allocator<double>_>::empty
                         ((vector<double,_std::allocator<double>_> *)
                          in_stack_ffffffffffffffb0._M_current), bVar1)) ||
     (in_RDX == (vector<double,_std::allocator<double>_> *)0x0)) {
    local_1 = false;
  }
  else {
    sVar3 = std::vector<double,_std::allocator<double>_>::size(in_RDX);
    if (sVar3 != (long)*(int *)(in_RDI + 1)) {
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)
                 CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                 in_stack_ffffffffffffffb8);
    }
    std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff98);
    std::vector<double,_std::allocator<double>_>::end(in_stack_ffffffffffffff98);
    __last._M_current._4_4_ = in_stack_ffffffffffffffac;
    __last._M_current._0_4_ = in_stack_ffffffffffffffa8;
    std::
    fill<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
              (in_stack_ffffffffffffffb0,__last,in_RDI);
    sVar3 = std::vector<double,_std::allocator<double>_>::size(in_RSI);
    iVar2 = (int)sVar3;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,0);
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](in_RDX,0);
    for (iVar7 = 0; iVar7 < iVar2; iVar7 = iVar7 + 1) {
      if ((pvVar4[iVar7] < in_RDI[2]) || (in_RDI[3] <= pvVar4[iVar7])) {
        if ((in_RDI[3] == pvVar4[iVar7]) && (!NAN(in_RDI[3]) && !NAN(pvVar4[iVar7]))) {
          pvVar5[*(int *)(in_RDI + 1) + -1] = pvVar5[*(int *)(in_RDI + 1) + -1] + 1.0;
        }
      }
      else {
        dVar6 = floor((pvVar4[iVar7] - in_RDI[2]) / in_RDI[4]);
        pvVar5[(int)dVar6] = pvVar5[(int)dVar6] + 1.0;
      }
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool HistogramCalculation::Run(const std::vector<double>& data,
                               std::vector<double>* histogram) const {
  // Check inputs.
  if (!is_valid_ || data.empty() || NULL == histogram) {
    return false;
  }

  // Prepare memories.
  if (histogram->size() != static_cast<std::size_t>(num_bin_)) {
    histogram->resize(num_bin_);
  }

  std::fill(histogram->begin(), histogram->end(), 0.0);

  const int length(static_cast<int>(data.size()));
  const double* input(&(data[0]));
  double* output(&((*histogram)[0]));
  for (int i(0); i < length; ++i) {
    if (lower_bound_ <= input[i] && input[i] < upper_bound_) {
      const int bin_index(
          static_cast<int>(std::floor((input[i] - lower_bound_) / bin_width_)));
      ++output[bin_index];
    } else if (upper_bound_ == input[i]) {
      ++output[num_bin_ - 1];
    }
  }

  return true;
}